

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_mesh.hpp
# Opt level: O2

ssize_t __thiscall sisl::utility::ply_mesh::write(ply_mesh *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  pointer pvVar5;
  pointer ptVar6;
  ostream *poVar7;
  CoeffReturnType pdVar8;
  undefined4 in_register_00000034;
  uint uVar9;
  ulong uVar10;
  _p p;
  ofstream fp;
  int aiStack_210 [120];
  
  std::ofstream::ofstream(&fp,*(char **)CONCAT44(in_register_00000034,__fd),_S_out|_S_bin);
  iVar1 = *(int *)((long)aiStack_210 + *(long *)(_fp + -0x18));
  if (iVar1 == 0) {
    poVar7 = std::operator<<((ostream *)&fp,"ply");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"format binary_little_endian 1.0");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"element vertex ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"property float x");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"property float y");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"property float z");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"property float nx");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"property float ny");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"property float nz");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"element face ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"property list uchar int vertex_indices");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&fp,"end_header");
    std::endl<char,std::char_traits<char>>(poVar7);
    uVar9 = 0;
    while( true ) {
      uVar10 = (ulong)uVar9;
      pvVar5 = (this->verts).super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->verts).
                        super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pvVar5 >> 5) <= uVar10) break;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          (pvVar5 + uVar10),0);
      p.x = (float)*pdVar8;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          ((this->verts).
                           super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
                           .super__Vector_impl_data._M_start + uVar10),1);
      p.y = (float)*pdVar8;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          ((this->verts).
                           super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
                           .super__Vector_impl_data._M_start + uVar10),2);
      p.z = (float)*pdVar8;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &(this->verts).
                           super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10].n,0);
      p.i = (float)*pdVar8;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &(this->verts).
                           super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10].n,1);
      p.j = (float)*pdVar8;
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &(this->verts).
                           super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10].n,2);
      p.k = (float)*pdVar8;
      std::ostream::write((char *)&fp,(long)&p);
      uVar9 = uVar9 + 1;
    }
    uVar9 = 0;
    while( true ) {
      uVar10 = (ulong)uVar9;
      ptVar6 = (this->faces).
               super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->faces).
                         super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar6) / 0xc) <= uVar10
         ) break;
      iVar2 = ptVar6[uVar10].super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>
              ._M_head_impl;
      p.x = (float)CONCAT31((int3)iVar2,3);
      iVar3 = ptVar6[uVar10].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Head_base<1UL,_int,_false>._M_head_impl;
      p.y._1_3_ = (undefined3)iVar3;
      p.y = (float)CONCAT31(p.y._1_3_,(char)((uint)iVar2 >> 0x18));
      uVar4 = ptVar6[uVar10].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Tuple_impl<2UL,_int>;
      p.z._1_3_ = (undefined3)uVar4;
      p.z = (float)CONCAT31(p.z._1_3_,(char)((uint)iVar3 >> 0x18));
      p.i._0_1_ = (undefined1)((uint)uVar4 >> 0x18);
      std::ostream::write((char *)&fp,(long)&p);
      uVar9 = uVar9 + 1;
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&fp);
  return CONCAT71((int7)((ulong)this >> 8),iVar1 == 0) & 0xffffffff;
}

Assistant:

bool write(const std::string &out) const {
            using namespace std;

            ofstream fp(out.c_str(), ios::out | ios::binary);
            if(!fp.good()) return false;

            // We're going to output in binary, but all PLY
            // files have an ascii header
            fp << "ply" << endl;
            fp << "format binary_little_endian 1.0" << endl;
            fp << "element vertex " << verts.size() << endl;
            fp << "property float x" << endl;
            fp << "property float y" << endl;
            fp << "property float z" << endl;
            fp << "property float nx" << endl;
            fp << "property float ny" << endl;
            fp << "property float nz" << endl;
            fp << "element face " << faces.size() << endl;
            fp << "property list uchar int vertex_indices" << endl;
            fp << "end_header" << endl;

            for(unsigned int i = 0; i < verts.size(); i++) {
                struct _p {
                    float x, y, z, i, j , k;
                }__attribute__ ((packed)) p;

                p.x = verts[i].p[0];
                p.y = verts[i].p[1];
                p.z = verts[i].p[2];
                p.i = verts[i].n[0];
                p.j = verts[i].n[1];
                p.k = verts[i].n[2];
                fp.write((char*)&p, sizeof(_p));
            }

            for(unsigned int i = 0; i < faces.size(); i++) {
                struct _f {
                    char t;
                    int i,j,k;
                } __attribute__ ((packed)) f;

                f.t = 3;
                f.i = std::get<0>(faces[i]);
                f.j = std::get<1>(faces[i]);
                f.k = std::get<2>(faces[i]);
                fp.write((char*)&f, sizeof(_f));
            }
            fp.close();
            return true;
        }